

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall
draco::ObjDecoder::ParseMaterialFile(ObjDecoder *this,string *file_name,Status *status)

{
  bool bVar1;
  string *in_RDI;
  DecoderBuffer old_buffer;
  vector<char,_std::allocator<char>_> buffer;
  string full_path;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  DecoderBuffer *this_00;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined8 local_a8;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  Status *pSVar2;
  ObjDecoder *this_01;
  undefined1 local_58 [87];
  byte local_1;
  
  GetFullPath(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1183ec);
  bVar1 = ReadFileToBuffer(in_RDI,in_stack_ffffffffffffff30);
  if (bVar1) {
    this_01 = (ObjDecoder *)in_RDI[9].field_2._M_allocated_capacity;
    local_a8 = *(undefined8 *)(in_RDI + 8);
    pSVar2 = (Status *)in_RDI[9]._M_string_length;
    this_00 = (DecoderBuffer *)local_58;
    in_stack_ffffffffffffff30 =
         (vector<char,_std::allocator<char>_> *)
         std::vector<char,_std::allocator<char>_>::data
                   ((vector<char,_std::allocator<char>_> *)0x118492);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)this_00);
    DecoderBuffer::Init(this_00,(char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18
                                                ),0x1184b3);
    *(undefined4 *)((long)&in_RDI->field_2 + 4) = 0;
    do {
      bVar1 = ParseMaterialFileDefinition(this_01,pSVar2);
    } while (bVar1);
    memcpy(in_RDI + 8,&local_a8,0x34);
    local_1 = 1;
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x11853d);
  }
  else {
    local_1 = 0;
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff30);
  std::__cxx11::string::~string((string *)(local_58 + 0x18));
  return (bool)(local_1 & 1);
}

Assistant:

bool ObjDecoder::ParseMaterialFile(const std::string &file_name,
                                   Status *status) {
  const std::string full_path = GetFullPath(file_name, input_file_name_);
  std::vector<char> buffer;
  if (!ReadFileToBuffer(full_path, &buffer)) {
    return false;
  }

  // Backup the original decoder buffer.
  DecoderBuffer old_buffer = buffer_;

  buffer_.Init(buffer.data(), buffer.size());

  num_materials_ = 0;
  while (ParseMaterialFileDefinition(status)) {
  }

  // Restore the original buffer.
  buffer_ = old_buffer;
  return true;
}